

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int UTF8ToUTF16(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  ushort *puVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  iVar7 = (int)outb;
  if (in == (uchar *)0x0) {
    if (1 < *outlen) {
      outb[0] = 0xff;
      outb[1] = 0xfe;
      *outlen = 2;
      *inlen = 0;
      return 2;
    }
    *outlen = 0;
    *inlen = 0;
    return 0;
  }
  iVar5 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      pbVar9 = in;
      if (0 < (long)*inlen) {
        pbVar8 = in + *inlen;
        puVar1 = (ushort *)(outb + (long)(*outlen / 2) * 2);
        do {
          bVar2 = *pbVar9;
          uVar4 = (uint)bVar2;
          lVar6 = 0;
          if ((char)bVar2 < '\0') {
            if (bVar2 < 0xc0) {
LAB_001445b0:
              *outlen = (int)outb - iVar7;
              *inlen = (int)pbVar9 - (int)in;
              return -2;
            }
            if (bVar2 < 0xe0) {
              uVar4 = bVar2 & 0x1f;
              lVar6 = 1;
            }
            else if (bVar2 < 0xf0) {
              uVar4 = bVar2 & 0xf;
              lVar6 = 2;
            }
            else {
              if (0xf7 < bVar2) goto LAB_001445b0;
              uVar4 = bVar2 & 7;
              lVar6 = 3;
            }
          }
          pbVar10 = pbVar9 + 1;
          iVar5 = (int)lVar6;
          if ((long)pbVar8 - (long)pbVar10 < lVar6) break;
          if (pbVar10 < pbVar8 && (char)bVar2 < '\0') {
            pbVar3 = pbVar9 + 2;
            do {
              pbVar10 = pbVar3;
              iVar5 = iVar5 + -1;
              if (((pbVar10[-1] & 0xffffffc0) != 0x80) ||
                 (uVar4 = pbVar10[-1] & 0x3f | uVar4 << 6, iVar5 == 0)) break;
              pbVar3 = pbVar10 + 1;
            } while (pbVar10 < pbVar8);
          }
          if (uVar4 < 0x10000) {
            if (puVar1 <= outb) break;
            *(ushort *)outb = (ushort)uVar4;
            outb = (uchar *)((long)outb + 2);
          }
          else {
            if ((0x10ffff < uVar4) || (puVar1 <= (ushort *)((long)outb + 2))) break;
            *(ushort *)outb = (ushort)(uVar4 + 0xff0000 >> 10) | 0xd800;
            *(ushort *)((long)outb + 2) = (ushort)uVar4 & 0x3ff | 0xdc00;
            outb = (uchar *)((long)outb + 4);
          }
          pbVar9 = pbVar10;
          if (pbVar8 <= pbVar10) break;
        } while( true );
      }
      *outlen = (int)outb - iVar7;
      *inlen = (int)pbVar9 - (int)in;
      return *outlen;
    }
    iVar5 = 0;
    *outlen = 0;
    *inlen = 0;
  }
  return iVar5;
}

Assistant:

static int
UTF8ToUTF16(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Added FFFE Byte Order Mark\n");
#endif
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(outb, outlen, in, inlen));
}